

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MasterTable.h
# Opt level: O0

ion_err_t __thiscall
MasterTable::addToMasterTable<int,int>
          (MasterTable *this,Dictionary<int,_int> *dictionary,ion_dictionary_size_t dictionary_size)

{
  undefined1 local_4c [8];
  ion_dictionary_config_info_t config;
  ion_err_t err;
  ion_dictionary_id_t id;
  ion_dictionary_size_t dictionary_size_local;
  Dictionary<int,_int> *dictionary_local;
  MasterTable *this_local;
  
  config.dictionary_type._3_1_ =
       ion_master_table_get_next_id((ion_dictionary_id_t *)&config.dictionary_status);
  this_local._7_1_ = config.dictionary_type._3_1_;
  if (config.dictionary_type._3_1_ == dictionary_type_bpp_tree_t >> 0x18) {
    ((dictionary->dict).instance)->id = config._28_4_;
    local_4c._0_4_ = ((dictionary->dict).instance)->id;
    local_4c[4] = '\0';
    config.id = ((dictionary->dict).instance)->key_type;
    config._4_4_ = (((dictionary->dict).instance)->record).key_size;
    config.type = (((dictionary->dict).instance)->record).value_size;
    config.value_size = ((dictionary->dict).instance)->type;
    config.dictionary_size._0_1_ = 0;
    config.key_size = dictionary_size;
    this_local._7_1_ = ion_master_table_write((ion_dictionary_config_info_t *)local_4c,-2);
  }
  return this_local._7_1_;
}

Assistant:

ion_err_t
addToMasterTable(
	Dictionary<K, V>		*dictionary,
	ion_dictionary_size_t dictionary_size
) {
	ion_dictionary_id_t id;

	ion_err_t err = ion_master_table_get_next_id(&id);

	if (err_ok != err) {
		return err;
	}

	dictionary->dict.instance->id = id;

	ion_dictionary_config_info_t config = {
		.id = dictionary->dict.instance->id, .use_type = 0, .type = dictionary->dict.instance->key_type, .key_size = dictionary->dict.instance->record.key_size, .value_size = dictionary->dict.instance->record.value_size, .dictionary_size = dictionary_size, .dictionary_type = dictionary->dict.instance->type
	};

	return ion_master_table_write(&config, ION_MASTER_TABLE_WRITE_FROM_END);
}